

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

void * SPRKStepCreate(ARKRhsFn f1,ARKRhsFn f2,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  N_Vector *v;
  int iVar1;
  ARKodeMem ark_mem;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  ARKodeMem local_40;
  sunrealtype local_38;
  
  if (f1 == (ARKRhsFn)0x0) {
    pcVar4 = "Must specify at least one of fe, fi (both NULL).";
    iVar1 = -0x16;
    iVar3 = 0x2e;
  }
  else if (f2 == (ARKRhsFn)0x0) {
    pcVar4 = "Must specify at least one of fe, fi (both NULL).";
    iVar1 = -0x16;
    iVar3 = 0x35;
  }
  else if (y0 == (N_Vector)0x0) {
    pcVar4 = "y0 = NULL illegal.";
    iVar1 = -0x16;
    iVar3 = 0x3d;
  }
  else if (sunctx == (SUNContext_conflict)0x0) {
    pcVar4 = "sunctx = NULL illegal.";
    iVar1 = -0x16;
    iVar3 = 0x44;
  }
  else {
    local_38 = t0;
    ark_mem = arkCreate(sunctx);
    if (ark_mem != (ARKodeMem)0x0) {
      local_40 = ark_mem;
      pvVar2 = calloc(1,0x48);
      if (pvVar2 == (void *)0x0) {
        arkProcessError(ark_mem,-0x14,0x57,"SPRKStepCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,"Allocation of arkode_mem failed.");
        return (void *)0x0;
      }
      iVar1 = arkAllocVec(ark_mem,y0,(N_Vector *)((long)pvVar2 + 0x10));
      if (iVar1 != 0) {
        v = (N_Vector *)((long)pvVar2 + 0x18);
        if (ark_mem->use_compensated_sums == 0) {
          *v = (N_Vector)0x0;
        }
        else {
          iVar1 = arkAllocVec(ark_mem,y0,v);
          if (iVar1 == 0) goto LAB_001592a6;
          N_VConst(0,*v);
        }
        ark_mem->step_init = sprkStep_Init;
        ark_mem->step_fullrhs = sprkStep_FullRHS;
        ark_mem->step = sprkStep_TakeStep;
        ark_mem->step_printallstats = sprkStep_PrintAllStats;
        ark_mem->step_writeparameters = sprkStep_WriteParameters;
        ark_mem->step_resize = sprkStep_Resize;
        ark_mem->step_free = sprkStep_Free;
        ark_mem->step_setdefaults = sprkStep_SetDefaults;
        ark_mem->step_setorder = sprkStep_SetOrder;
        ark_mem->step_getnumrhsevals = sprkStep_GetNumRhsEvals;
        ark_mem->step_mem = pvVar2;
        iVar1 = sprkStep_SetDefaults(ark_mem);
        if (iVar1 == 0) {
          *(ARKRhsFn *)((long)pvVar2 + 0x20) = f1;
          *(ARKRhsFn *)((long)pvVar2 + 0x28) = f2;
          *(undefined8 *)((long)pvVar2 + 0x30) = 0;
          *(undefined8 *)((long)pvVar2 + 0x38) = 0;
          *(undefined4 *)((long)pvVar2 + 0x40) = 0;
          ARKodeSetInterpolantType(ark_mem,1);
          iVar1 = arkInit(ark_mem,local_38,y0,0);
          if (iVar1 == 0) {
            return ark_mem;
          }
          pcVar4 = "Unable to initialize main ARKODE infrastructure";
          iVar3 = 0x96;
        }
        else {
          pcVar4 = "Error setting default solver options";
          iVar3 = 0x7f;
        }
        arkProcessError(ark_mem,iVar1,iVar3,"SPRKStepCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,pcVar4);
      }
LAB_001592a6:
      ARKodeFree(&local_40);
      return (void *)0x0;
    }
    pcVar4 = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    iVar3 = 0x4d;
    local_40 = (ARKodeMem)0x0;
  }
  arkProcessError((ARKodeMem)0x0,iVar1,iVar3,"SPRKStepCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                  ,pcVar4);
  return (void *)0x0;
}

Assistant:

void* SPRKStepCreate(ARKRhsFn f1, ARKRhsFn f2, sunrealtype t0, N_Vector y0,
                     SUNContext sunctx)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* Check that f1 and f2 are supplied */
  if (!f1)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  if (!f2)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (!y0)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeSPRKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeSPRKStepMem)malloc(sizeof(struct ARKodeSPRKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeSPRKStepMemRec));

  /* Allocate vectors in stepper mem */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  if (ark_mem->use_compensated_sums)
  {
    if (!arkAllocVec(ark_mem, y0, &(step_mem->yerr)))
    {
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    /* Zero yerr for compensated summation */
    N_VConst(ZERO, step_mem->yerr);
  }
  else { step_mem->yerr = NULL; }
  ark_mem->step_init            = sprkStep_Init;
  ark_mem->step_fullrhs         = sprkStep_FullRHS;
  ark_mem->step                 = sprkStep_TakeStep;
  ark_mem->step_printallstats   = sprkStep_PrintAllStats;
  ark_mem->step_writeparameters = sprkStep_WriteParameters;
  ark_mem->step_resize          = sprkStep_Resize;
  ark_mem->step_free            = sprkStep_Free;
  ark_mem->step_setdefaults     = sprkStep_SetDefaults;
  ark_mem->step_setorder        = sprkStep_SetOrder;
  ark_mem->step_getnumrhsevals  = sprkStep_GetNumRhsEvals;
  ark_mem->step_mem             = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = sprkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f1 = f1;
  step_mem->f2 = f2;

  /* Initialize the counters */
  step_mem->nf1    = 0;
  step_mem->nf2    = 0;
  step_mem->istage = 0;

  /* SPRKStep uses Lagrange interpolation by default, since Hermite is
     less compatible with these methods. */
  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}